

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O2

int main(int param_1,char **param_2)

{
  int iVar1;
  
  plan(7);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  matras_allocator_create(&pta_allocator,0x40,pta_alloc,pta_free);
  matras_allocator_create(&ver_allocator,0x200,all,dea);
  matras_alloc_test();
  matras_vers_test();
  matras_gh_1145_test();
  matras_stats_test();
  matras_alloc_overflow_test();
  matras_alloc_range_overflow_test();
  matras_touch_reserve_test();
  matras_allocator_destroy(&pta_allocator);
  matras_allocator_destroy(&ver_allocator);
  _space(_stdout);
  printf("# *** %s: done ***\n","main");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int
main(int, const char **)
{
	plan(7);
	header();

	matras_allocator_create(&pta_allocator,
				PROV_EXTENT_SIZE,
				pta_alloc, pta_free);
	matras_allocator_create(&ver_allocator, VER_EXTENT_SIZE, all, dea);

	matras_alloc_test();
	matras_vers_test();
	matras_gh_1145_test();
	matras_stats_test();
	matras_alloc_overflow_test();
	matras_alloc_range_overflow_test();
	matras_touch_reserve_test();

	matras_allocator_destroy(&pta_allocator);
	matras_allocator_destroy(&ver_allocator);

	footer();
	return check_plan();
}